

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O0

int Bac_BoxDup(Bac_Ntk_t *pNew,Bac_Ntk_t *p,int iBox)

{
  int iVar1;
  int iVar2;
  Bac_Ntk_t *pBVar3;
  bool bVar4;
  undefined4 local_24;
  int iBoxNew;
  int iTerm;
  int i;
  int iBox_local;
  Bac_Ntk_t *p_local;
  Bac_Ntk_t *pNew_local;
  
  local_24 = Bac_BoxBiNum(p,iBox);
  local_24 = iBox - local_24;
  while( true ) {
    iVar1 = Bac_ObjIsBi(p,local_24);
    if (iVar1 == 0) break;
    Bac_ObjDup(pNew,p,local_24);
    local_24 = local_24 + 1;
  }
  iVar1 = Bac_ObjDup(pNew,p,iBox);
  iVar2 = Bac_NtkHasNames(p);
  if (iVar2 != 0) {
    iVar2 = Bac_NtkHasNames(pNew);
    if (iVar2 != 0) {
      iVar2 = Bac_ObjName(p,iBox);
      if (iVar2 != 0) {
        iVar2 = Bac_ObjName(p,iBox);
        Bac_ObjSetName(pNew,iVar1,iVar2);
      }
    }
  }
  pBVar3 = Bac_BoxNtk(p,iBox);
  if (pBVar3 != (Bac_Ntk_t *)0x0) {
    pBVar3 = Bac_BoxNtk(p,iBox);
    iVar2 = Bac_NtkCopy(pBVar3);
    Bac_BoxSetNtkId(pNew,iVar1,iVar2);
  }
  local_24 = iBox + 1;
  while( true ) {
    iVar2 = Bac_NtkObjNum(p);
    bVar4 = false;
    if (local_24 < iVar2) {
      iVar2 = Bac_ObjIsBo(p,local_24);
      bVar4 = iVar2 != 0;
    }
    if (!bVar4) break;
    Bac_ObjDup(pNew,p,local_24);
    local_24 = local_24 + 1;
  }
  return iVar1;
}

Assistant:

static inline int Bac_BoxDup( Bac_Ntk_t * pNew, Bac_Ntk_t * p, int iBox )
{
    int i, iTerm, iBoxNew;
    Bac_BoxForEachBiReverse( p, iBox, iTerm, i )
        Bac_ObjDup( pNew, p, iTerm );
    iBoxNew = Bac_ObjDup( pNew, p, iBox );
    if ( Bac_NtkHasNames(p) && Bac_NtkHasNames(pNew) && Bac_ObjName(p, iBox) ) 
        Bac_ObjSetName( pNew, iBoxNew, Bac_ObjName(p, iBox) );
    if ( Bac_BoxNtk(p, iBox) )
        Bac_BoxSetNtkId( pNew, iBoxNew, Bac_NtkCopy(Bac_BoxNtk(p, iBox)) );
    Bac_BoxForEachBo( p, iBox, iTerm, i )
        Bac_ObjDup( pNew, p, iTerm );
    return iBoxNew;
}